

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O1

void __thiscall
ddd::DictionarySGL<false,_false>::enumerate
          (DictionarySGL<false,_false> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  DaTrie<false,_false,_false> *pDVar1;
  string local_30;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear(kvs);
  pDVar1 = (this->trie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl;
  if (*(pointer *)&(pDVar1->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> !=
      *(pointer *)((long)&(pDVar1->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8))
  {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve(kvs,this->num_keys_);
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    DaTrie<false,_false,_false>::enumerate
              ((this->trie_)._M_t.
               super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
               .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl,0,
               &local_30,kvs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (trie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);
    trie_->enumerate(ROOT_POS, std::string(), kvs);
  }